

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashUtils.hpp
# Opt level: O1

void __thiscall
Diligent::HashCombiner<Diligent::DefaultHasher,_Diligent::SamplerDesc>::operator()
          (HashCombiner<Diligent::DefaultHasher,_Diligent::SamplerDesc> *this,SamplerDesc *SamDesc)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  uint local_30;
  uint local_2c;
  uint local_28;
  uint local_24;
  
  uVar1._0_1_ = SamDesc->MinFilter;
  uVar1._1_1_ = SamDesc->MagFilter;
  local_24 = (uint)SamDesc->MipFilter << 0x18 | (uint)uVar1;
  uVar2._0_1_ = SamDesc->AddressU;
  uVar2._1_1_ = SamDesc->AddressV;
  local_28 = (uint)SamDesc->AddressW << 0x18 | (uint)uVar2;
  uVar3._0_1_ = SamDesc->Flags;
  uVar3._1_1_ = SamDesc->UnnormalizedCoords;
  local_2c = (uint)uVar3;
  local_30 = (uint)SamDesc->ComparisonFunc;
  HashCombine<unsigned_int,unsigned_int,unsigned_int,float,unsigned_int,unsigned_int,float,float,float,float,float,float>
            (&((this->super_HashCombinerBase<Diligent::DefaultHasher>).m_Hasher)->m_Seed,&local_24,
             &local_28,&local_2c,(float *)&SamDesc->MipLODBias,&SamDesc->MaxAnisotropy,&local_30,
             (float *)SamDesc->BorderColor,(float *)(SamDesc->BorderColor + 1),
             (float *)(SamDesc->BorderColor + 2),(float *)(SamDesc->BorderColor + 3),
             &SamDesc->MinLOD,&SamDesc->MaxLOD);
  return;
}

Assistant:

void operator()(const SamplerDesc& SamDesc) const
    {
        ASSERT_SIZEOF(SamDesc.MinFilter, 1, "Hash logic below may be incorrect.");
        ASSERT_SIZEOF(SamDesc.MagFilter, 1, "Hash logic below may be incorrect.");
        ASSERT_SIZEOF(SamDesc.MipFilter, 1, "Hash logic below may be incorrect.");
        ASSERT_SIZEOF(SamDesc.AddressU, 1, "Hash logic below may be incorrect.");
        ASSERT_SIZEOF(SamDesc.AddressV, 1, "Hash logic below may be incorrect.");
        ASSERT_SIZEOF(SamDesc.AddressW, 1, "Hash logic below may be incorrect.");
        ASSERT_SIZEOF(SamDesc.Flags, 1, "Hash logic below may be incorrect.");
        ASSERT_SIZEOF(SamDesc.BorderColor, 16, "Hash logic below may be incorrect.");

        // Ignore Name. This is consistent with the operator==
        this->m_Hasher( // SamDesc.Name,
            ((static_cast<uint32_t>(SamDesc.MinFilter) << 0u) |
             (static_cast<uint32_t>(SamDesc.MagFilter) << 8u) |
             (static_cast<uint32_t>(SamDesc.MipFilter) << 24u)),
            ((static_cast<uint32_t>(SamDesc.AddressU) << 0u) |
             (static_cast<uint32_t>(SamDesc.AddressV) << 8u) |
             (static_cast<uint32_t>(SamDesc.AddressW) << 24u)),
            ((static_cast<uint32_t>(SamDesc.Flags) << 0u) |
             ((SamDesc.UnnormalizedCoords ? 1u : 0u) << 8u)),
            SamDesc.MipLODBias,
            SamDesc.MaxAnisotropy,
            static_cast<uint32_t>(SamDesc.ComparisonFunc),
            SamDesc.BorderColor[0],
            SamDesc.BorderColor[1],
            SamDesc.BorderColor[2],
            SamDesc.BorderColor[3],
            SamDesc.MinLOD,
            SamDesc.MaxLOD);
        ASSERT_SIZEOF64(SamDesc, 56, "Did you add new members to SamplerDesc? Please handle them here.");
    }